

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void whereInfoFree(sqlite3 *db,WhereInfo *pWInfo)

{
  WhereLoop *p_00;
  WhereMemBlock *pWVar1;
  WhereMemBlock *p_01;
  WhereLoop *p;
  
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while (p_00 = pWInfo->pLoops, p_00 != (WhereLoop *)0x0) {
    pWInfo->pLoops = p_00->pNextLoop;
    whereLoopClear(db,p_00);
    sqlite3DbNNFreeNN(db,p_00);
  }
  p_01 = pWInfo->pMemToFree;
  while (p_01 != (WhereMemBlock *)0x0) {
    pWVar1 = p_01->pNext;
    sqlite3DbNNFreeNN(db,p_01);
    pWInfo->pMemToFree = pWVar1;
    p_01 = pWVar1;
  }
  sqlite3DbNNFreeNN(db,pWInfo);
  return;
}

Assistant:

static void whereInfoFree(sqlite3 *db, WhereInfo *pWInfo){
  assert( pWInfo!=0 );
  assert( db!=0 );
  sqlite3WhereClauseClear(&pWInfo->sWC);
  while( pWInfo->pLoops ){
    WhereLoop *p = pWInfo->pLoops;
    pWInfo->pLoops = p->pNextLoop;
    whereLoopDelete(db, p);
  }
  while( pWInfo->pMemToFree ){
    WhereMemBlock *pNext = pWInfo->pMemToFree->pNext;
    sqlite3DbNNFreeNN(db, pWInfo->pMemToFree);
    pWInfo->pMemToFree = pNext;
  }
  sqlite3DbNNFreeNN(db, pWInfo);
}